

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprog.c
# Opt level: O0

void pulse_prog_cornogun(CHAR_DATA *mob)

{
  int iVar1;
  CHAR_DATA *in_RDI;
  char *unaff_retaddr;
  int in_stack_0000005c;
  void *in_stack_00000060;
  CHAR_DATA *in_stack_00000068;
  int in_stack_00000070;
  int in_stack_00000074;
  undefined4 in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  uint in_stack_fffffffffffffff0;
  
  iVar1 = number_percent();
  if ((iVar1 == 1) && (in_RDI->position == 8)) {
    iVar1 = number_range(in_stack_fffffffffffffff0,in_stack_ffffffffffffffec);
    if (iVar1 == 0) {
      act(unaff_retaddr,in_RDI,(void *)(ulong)in_stack_fffffffffffffff0,
          (void *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),0);
    }
    else if (iVar1 == 1) {
      act(unaff_retaddr,in_RDI,(void *)CONCAT44(1,in_stack_fffffffffffffff0),
          (void *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),0);
    }
    else if (iVar1 == 2) {
      act(unaff_retaddr,in_RDI,(void *)CONCAT44(2,in_stack_fffffffffffffff0),
          (void *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),0);
    }
    else {
      skill_lookup((char *)in_RDI);
      spell_faerie_fog(in_stack_00000074,in_stack_00000070,in_stack_00000068,in_stack_00000060,
                       in_stack_0000005c);
    }
  }
  return;
}

Assistant:

void pulse_prog_cornogun(CHAR_DATA *mob)
{
	if (number_percent() != 1 || mob->position != POS_STANDING)
		return;

	switch (number_range(0, 10))
	{
		case 0:
			act("$n chitters annoyingly at everyone in the room.", mob, 0, 0, TO_ROOM);
			break;
		case 1:
			act("$n pauses momentarily to spit, leaving a disgusting substance all over the floor.", mob, 0, 0, TO_ROOM);
			break;
		case 2:
			act("$n ceases flapping its wings incessantly to let out a mournful screech.", mob, 0, 0, TO_ROOM);
			break;
		default:
			spell_faerie_fog(skill_lookup("faerie fog"), mob->level, mob, nullptr, TAR_IGNORE);
			break;
	}
}